

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::__cxx11::string>
          (Attribute *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  value_type *pvVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_48 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  Attribute *this_local;
  
  if (v == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._24_8_ = v;
    primvar::PrimVar::get_value<std::__cxx11::string>(&local_70,&this->_var);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_48,&local_70);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(&local_70);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_48);
      std::__cxx11::string::operator=((string *)ret.contained._24_8_,(string *)pvVar1);
    }
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }